

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O0

ostream * __thiscall
bhf::ads::TcLicenseOnlineInfo::ShowStatus(TcLicenseOnlineInfo *this,ostream *os)

{
  allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ostream *poVar4;
  void *this_01;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  _Self local_110;
  _Self local_108;
  const_iterator it;
  int local_f8 [7];
  int local_dc;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  iterator local_30;
  size_type local_28;
  ostream *local_20;
  ostream *os_local;
  TcLicenseOnlineInfo *this_local;
  
  local_20 = os;
  os_local = (ostream *)this;
  if (ShowStatus(std::ostream&)::states_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ShowStatus(std::ostream&)::states_abi_cxx11_);
    if (iVar2 != 0) {
      local_d8 = &local_d0;
      local_dc = 0;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[6],_true>(local_d8,&local_dc,(char (*) [6])"Valid");
      local_d8 = &local_a8;
      local_f8[2] = 0x203;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[16],_true>(local_d8,local_f8 + 2,(char (*) [16])"Valid (Pending)");
      local_d8 = &local_80;
      local_f8[1] = 0x254;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[14],_true>(local_d8,local_f8 + 1,(char (*) [14])"Valid (Trial)");
      local_d8 = &local_58;
      local_f8[0] = 0x255;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[12],_true>(local_d8,local_f8,(char (*) [12])"Valid (OEM)");
      local_30 = &local_d0;
      local_28 = 4;
      this_00 = (allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&it._M_node + 6);
      std::
      allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(this_00);
      __l._M_len = local_28;
      __l._M_array = local_30;
      std::
      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&ShowStatus(std::ostream&)::states_abi_cxx11_,__l,
            (less<unsigned_int> *)((long)&it._M_node + 7),this_00);
      std::
      allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&it._M_node + 6));
      local_128 = (pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30;
      do {
        local_128 = local_128 + -1;
        std::
        pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_128);
      } while (local_128 != &local_d0);
      __cxa_atexit(std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&ShowStatus(std::ostream&)::states_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ShowStatus(std::ostream&)::states_abi_cxx11_);
    }
  }
  local_108._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&ShowStatus(std::ostream&)::states_abi_cxx11_,&this->nResult);
  local_110._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&ShowStatus(std::ostream&)::states_abi_cxx11_);
  bVar1 = std::operator!=(&local_110,&local_108);
  poVar4 = local_20;
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_108);
    this_local = (TcLicenseOnlineInfo *)std::operator<<(poVar4,(string *)&ppVar3->second);
  }
  else {
    poVar4 = std::operator<<(local_20,"0x");
    this_01 = (void *)std::ostream::operator<<(poVar4,std::hex);
    this_local = (TcLicenseOnlineInfo *)std::ostream::operator<<(this_01,this->nResult);
  }
  return (ostream *)this_local;
}

Assistant:

std::ostream& ShowStatus(std::ostream& os) const
    {
        static const std::map<uint32_t, std::string> states = {
            { 0, "Valid" },
            { 515, "Valid (Pending)" },
            { 596, "Valid (Trial)" },
            { 597, "Valid (OEM)" },
        };
        const auto it = states.find(nResult);
        if (states.end() != it) {
            return os << it->second;
        }
        return os << "0x" << std::hex << nResult;
    }